

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

bool rr::LineRasterUtil::vertexOnLineSegment(Vector<long,_2> *p,SubpixelLineSegment *l)

{
  bool bVar1;
  long lVar2;
  bool local_61;
  Vector<long,_2> local_60;
  undefined1 local_50 [8];
  Vector<long,_2> u2;
  Vector<long,_2> u1;
  Vector<long,_2> v;
  SubpixelLineSegment *l_local;
  Vector<long,_2> *p_local;
  
  bVar1 = vertexOnLine(p,l);
  if (bVar1) {
    SubpixelLineSegment::direction((SubpixelLineSegment *)(u1.m_data + 1));
    tcu::operator-((tcu *)(u2.m_data + 1),p,&l->m_v0);
    tcu::operator-((tcu *)local_50,p,&l->m_v1);
    lVar2 = tcu::Vector<long,_2>::x((Vector<long,_2> *)(u1.m_data + 1));
    if ((lVar2 == 0) &&
       (lVar2 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(u1.m_data + 1)), lVar2 == 0)) {
      return false;
    }
    lVar2 = tcu::dot<long,2>((Vector<long,_2> *)(u1.m_data + 1),(Vector<long,_2> *)(u2.m_data + 1));
    local_61 = false;
    if (-1 < lVar2) {
      tcu::operator-((tcu *)&local_60,(Vector<long,_2> *)(u1.m_data + 1));
      lVar2 = tcu::dot<long,2>(&local_60,(Vector<long,_2> *)local_50);
      local_61 = -1 < lVar2;
    }
    p_local._7_1_ = local_61;
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

static bool vertexOnLineSegment (const tcu::Vector<deInt64,2>& p, const SubpixelLineSegment& l)
{
	if (!vertexOnLine(p, l))
		return false;

	const tcu::Vector<deInt64,2> v	= l.direction();
	const tcu::Vector<deInt64,2> u1	= ( p - l.m_v0);
	const tcu::Vector<deInt64,2> u2	= ( p - l.m_v1);

	if (v.x() == 0 && v.y() == 0)
		return false;

	return	tcu::dot( v, u1) >= 0 &&
			tcu::dot(-v, u2) >= 0; // dot (A->B, A->V) >= 0 and dot (B->A, B->V) >= 0
}